

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O0

void __thiscall
Args::Arg::Arg<QLatin1String>(Arg *this,QLatin1String *name,bool isWithValue,bool isRequired)

{
  QLatin1String str;
  byte in_CL;
  byte in_DL;
  ArgIface *in_RDI;
  char *in_stack_ffffffffffffff88;
  String *in_stack_ffffffffffffff90;
  qsizetype in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  
  ArgIface::ArgIface(in_RDI);
  in_RDI->_vptr_ArgIface = (_func_int **)&PTR__Arg_00131858;
  *(byte *)&in_RDI[1]._vptr_ArgIface = in_DL & 1;
  *(byte *)((long)&in_RDI[1]._vptr_ArgIface + 1) = in_CL & 1;
  *(undefined1 *)((long)&in_RDI[1]._vptr_ArgIface + 2) = 0;
  String::String((String *)0x1054c5);
  String::String((String *)0x1054da);
  str.m_data = in_stack_ffffffffffffffa0;
  str.m_size = in_stack_ffffffffffffff98;
  String::String(in_stack_ffffffffffffff90,str);
  String::String(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  String::String((String *)0x105537);
  String::String((String *)0x10554f);
  String::String((String *)0x105562);
  return;
}

Assistant:

Arg::Arg( T && name,
	bool isWithValue, bool isRequired )
	:	m_isWithValue( isWithValue )
	,	m_isRequired( isRequired )
	,	m_isDefined( false )
	,	m_name( std::forward< T > ( name ) )
	,	m_valueSpecifier( SL( "arg" ) )
{
}